

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_packsw_aarch64(CPUARMState_conflict *env,uint64_t a,uint64_t b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t b_local;
  uint64_t a_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = a >> 0x10 & 0xff;
  uVar2 = uVar1 << 8;
  uVar3 = a >> 0x20 & 0xff;
  uVar4 = uVar3 << 0x10;
  uVar5 = a >> 0x30 & 0xff;
  uVar6 = uVar5 << 0x18;
  uVar7 = (b & 0xff) << 0x20;
  uVar8 = b >> 0x10 & 0xff;
  uVar9 = uVar8 << 0x28;
  uVar10 = b >> 0x20 & 0xff;
  uVar11 = uVar10 << 0x30;
  uVar12 = (b >> 0x30) << 0x38;
  (env->iwmmxt).cregs[3] =
       (uint)((a & 0x80) != 0) << 3 | (uint)((a & 0xff) == 0) << 2 |
       (uint)((uVar2 & 0x8000) != 0) << 7 | (uint)(uVar1 == 0) << 6 |
       (uint)((uVar4 & 0x800000) != 0) << 0xb | (uint)(uVar3 == 0) << 10 |
       (uint)((uVar6 & 0x80000000) != 0) << 0xf | (uint)(uVar5 == 0) << 0xe |
       (uint)((uVar7 & 0x8000000000) != 0) << 0x13 | (uint)((b & 0xff) == 0) << 0x12 |
       (uint)((uVar9 & 0x800000000000) != 0) << 0x17 | (uint)(uVar8 == 0) << 0x16 |
       (uint)((uVar11 & 0x80000000000000) != 0) << 0x1b | (uint)(uVar10 == 0) << 0x1a |
       (uint)((uVar12 & 0x8000000000000000) != 0) << 0x1f | (uint)((b >> 0x30 & 0xff) == 0) << 0x1e;
  return a & 0xff | uVar2 | uVar4 | uVar6 | uVar7 | uVar9 | uVar11 | uVar12;
}

Assistant:

uint64_t HELPER(iwmmxt_packsw)(CPUARMState *env, uint64_t a, uint64_t b)
{
    a = (((a >> 0) & 0xff) << 0) | (((a >> 16) & 0xff) << 8) |
        (((a >> 32) & 0xff) << 16) | (((a >> 48) & 0xff) << 24) |
        (((b >> 0) & 0xff) << 32) | (((b >> 16) & 0xff) << 40) |
        (((b >> 32) & 0xff) << 48) | (((b >> 48) & 0xff) << 56);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT8(a >> 0, 0) | NZBIT8(a >> 8, 1) |
        NZBIT8(a >> 16, 2) | NZBIT8(a >> 24, 3) |
        NZBIT8(a >> 32, 4) | NZBIT8(a >> 40, 5) |
        NZBIT8(a >> 48, 6) | NZBIT8(a >> 56, 7);
    return a;
}